

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

string * __thiscall
kratos::InterfaceRef::base_name_abi_cxx11_(string *__return_storage_ptr__,InterfaceRef *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

std::string InterfaceRef::base_name() const { return name(); }